

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_23::AssertionPrinter::printIssue(AssertionPrinter *this,char *issue)

{
  ostream *poVar1;
  size_t sVar2;
  char local_11;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->stream,&local_11,1);
  if (issue == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(issue);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,issue,sVar2);
  }
  return;
}

Assistant:

void printIssue(char const *issue) const {
                stream << ' ' << issue;
            }